

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

void M680X_get_insn_id(cs_struct *handle,cs_insn *insn,uint id)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  inst_pageX *inst_pageX_table;
  
  plVar1 = *(long **)((long)handle->printer_info + 0xf0);
  insn->id = 0x9f;
  lVar5 = -3;
LAB_0023d3e4:
  if (((lVar5 != 0) && (lVar2 = lVar5 + 0xc, plVar1[lVar2] != 0)) &&
     (inst_pageX_table = (inst_pageX *)plVar1[lVar5 + 9], inst_pageX_table != (inst_pageX *)0x0))
  goto code_r0x0023d3fd;
  if ((id & 0xff00) != 0) {
    return;
  }
  uVar4 = *(uint *)(*plVar1 + (ulong)id * 4) & 0x1ff;
  insn->id = uVar4;
  if (uVar4 != 0x9f) {
    return;
  }
  lVar5 = -0x10;
  do {
    if (lVar5 == 0) {
      return;
    }
    lVar2 = *(long *)((long)plVar1 + lVar5 + 0x28);
    if (lVar2 == 0) {
      return;
    }
    inst_pageX_table = *(inst_pageX **)((long)plVar1 + lVar5 + 0x18);
    if (inst_pageX_table == (inst_pageX *)0x0) {
      return;
    }
    uVar4 = binary_search(inst_pageX_table,(int)lVar2,(uint8_t)id);
    lVar5 = lVar5 + 8;
  } while ((int)uVar4 < 0);
  goto LAB_0023d41a;
code_r0x0023d3fd:
  lVar3 = lVar5 + 0x2b;
  lVar5 = lVar5 + 1;
  if (*(char *)((long)plVar1 + lVar3) == (char)(id >> 8)) {
    uVar4 = binary_search(inst_pageX_table,(int)plVar1[lVar2],(uint8_t)id);
    if ((int)uVar4 < 0) {
      uVar4 = 0x9f;
    }
    else {
LAB_0023d41a:
      uVar4 = (uint)inst_pageX_table[uVar4] >> 8 & 0x1ff;
    }
    insn->id = uVar4;
    return;
  }
  goto LAB_0023d3e4;
}

Assistant:

void M680X_get_insn_id(cs_struct *handle, cs_insn *insn, unsigned int id)
{
	const m680x_info *const info = (const m680x_info *)handle->printer_info;
	const cpu_tables *cpu = info->cpu;
	uint8_t insn_prefix = (id >> 8) & 0xff;
	int index;
	int i;

	insn->id = M680X_INS_ILLGL;

	for (i = 0; i < ARR_SIZE(cpu->pageX_prefix); ++i) {
		if (cpu->pageX_table_size[i] == 0 ||
			(cpu->inst_pageX_table[i] == NULL))
			break;

		if (cpu->pageX_prefix[i] == insn_prefix) {
			index = binary_search(cpu->inst_pageX_table[i],
					cpu->pageX_table_size[i], id & 0xff);
			insn->id = (index >= 0) ?
				cpu->inst_pageX_table[i][index].insn :
				M680X_INS_ILLGL;
			return;
		}
	}

	if (insn_prefix != 0)
		return;

	insn->id = cpu->inst_page1_table[id].insn;

	if (insn->id != M680X_INS_ILLGL)
		return;

	// Check if opcode byte is present in an overlay table
	for (i = 0; i < ARR_SIZE(cpu->overlay_table_size); ++i) {
		if (cpu->overlay_table_size[i] == 0 ||
			(cpu->inst_overlay_table[i] == NULL))
			break;

		if ((index = binary_search(cpu->inst_overlay_table[i],
						cpu->overlay_table_size[i],
						id & 0xff)) >= 0) {
			insn->id = cpu->inst_overlay_table[i][index].insn;
			return;
		}
	}
}